

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandListBase.hpp
# Opt level: O0

void __thiscall
Diligent::CommandListBase<Diligent::EngineVkImplTraits>::CommandListBase
          (CommandListBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,DeviceContextImplType *pDeferredCtx,bool bIsDeviceInternal)

{
  DeviceContextDesc *pDVar1;
  Char *Message;
  char (*Args_1) [35];
  undefined1 local_58 [8];
  string msg;
  bool bIsDeviceInternal_local;
  DeviceContextImplType *pDeferredCtx_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  CommandListBase<Diligent::EngineVkImplTraits> *this_local;
  
  memset((void *)((long)&msg.field_2 + 8),0,8);
  CommandListDesc::CommandListDesc((CommandListDesc *)((long)&msg.field_2 + 8));
  DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
                     ,pRefCounters,pDevice,(CommandListDesc *)((long)&msg.field_2 + 8),
                     bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
  ).super_ObjectBase<Diligent::ICommandList>.super_RefCountedObject<Diligent::ICommandList>.
  super_ICommandList.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_013a23f8;
  pDVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::GetDesc
                     ((DeviceContextBase<Diligent::EngineVkImplTraits> *)pDeferredCtx);
  Args_1 = (char (*) [35])CONCAT71((int7)((ulong)pDVar1 >> 8),pDVar1->QueueId);
  this->m_QueueId = pDVar1->QueueId;
  pDVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::GetDesc
                     ((DeviceContextBase<Diligent::EngineVkImplTraits> *)pDeferredCtx);
  if ((pDVar1->IsDeferred & 1U) == 0) {
    FormatString<char[26],char[35]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pDeferredCtx->GetDesc().IsDeferred",Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CommandListBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/CommandListBase.hpp"
               ,0x49);
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

CommandListBase(IReferenceCounters*    pRefCounters,
                    RenderDeviceImplType*  pDevice,
                    DeviceContextImplType* pDeferredCtx,
                    bool                   bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, CommandListDesc{}, bIsDeviceInternal},
        m_QueueId{pDeferredCtx->GetDesc().QueueId}
    {
        VERIFY_EXPR(pDeferredCtx->GetDesc().IsDeferred);
    }